

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

QAbstractButton * __thiscall
QAbstractButtonPrivate::queryCheckedButton(QAbstractButtonPrivate *this)

{
  QAbstractButton *pQVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  QAbstractButtonPrivate *pQVar4;
  QAbstractButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *b;
  int i;
  QAbstractButton *q;
  QList<QAbstractButton_*> buttonList;
  qsizetype in_stack_ffffffffffffff98;
  QList<QAbstractButton_*> *in_stack_ffffffffffffffa0;
  QAbstractButtonPrivate *in_stack_ffffffffffffffb8;
  int local_40;
  QAbstractButton *local_28;
  QList<QAbstractButton_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->group == (QButtonGroup *)0x0) {
    pQVar1 = q_func(in_RDI);
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    queryButtonList(in_stack_ffffffffffffffb8);
    if ((((byte)in_RDI->field_0x28c >> 3 & 1) == 0) ||
       (qVar2 = QList<QAbstractButton_*>::size(&local_20), qVar2 == 1)) {
      local_28 = (QAbstractButton *)0x0;
    }
    else {
      for (local_40 = 0; qVar2 = QList<QAbstractButton_*>::size(&local_20), local_40 < qVar2;
          local_40 = local_40 + 1) {
        ppQVar3 = QList<QAbstractButton_*>::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        local_28 = *ppQVar3;
        pQVar4 = QAbstractButton::d_func((QAbstractButton *)0x4fe033);
        if ((((byte)pQVar4->field_0x28c >> 1 & 1) != 0) && (local_28 != pQVar1)) goto LAB_004fe0b5;
      }
      local_28 = pQVar1;
      if (((byte)in_RDI->field_0x28c >> 1 & 1) == 0) {
        local_28 = (QAbstractButton *)0x0;
      }
    }
LAB_004fe0b5:
    QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x4fe0bf);
  }
  else {
    QButtonGroup::d_func((QButtonGroup *)0x4fdf50);
    local_28 = ::QPointer::operator_cast_to_QAbstractButton_((QPointer<QAbstractButton> *)0x4fdf5f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

QAbstractButton *QAbstractButtonPrivate::queryCheckedButton() const
{
#if QT_CONFIG(buttongroup)
    if (group)
        return group->d_func()->checkedButton;
#endif

    Q_Q(const QAbstractButton);
    QList<QAbstractButton *> buttonList = queryButtonList();
    if (!autoExclusive || buttonList.size() == 1) // no group
        return nullptr;

    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *b = buttonList.at(i);
        if (b->d_func()->checked && b != q)
            return b;
    }
    return checked  ? const_cast<QAbstractButton *>(q) : nullptr;
}